

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O0

string * __thiscall
gl4cts::(anonymous_namespace)::BasicAllTargetsStore::GenFS<tcu::Vector<float,4>>
          (string *__return_storage_ptr__,BasicAllTargetsStore *this,GLenum internalformat,
          Vector<float,_4> *write_value)

{
  ostream *poVar1;
  string local_5b0;
  string local_590;
  string local_570;
  string local_550;
  string local_530;
  string local_510;
  string local_4f0;
  string local_4d0;
  string local_4b0;
  string local_490;
  string local_470;
  string local_450;
  string local_430;
  string local_410;
  string local_3f0;
  string local_3d0;
  string local_3b0;
  string local_390;
  string local_370;
  string local_350;
  string local_330;
  string local_310;
  string local_2f0;
  string local_2d0;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  ostringstream local_1a0 [8];
  ostringstream os;
  Vector<float,_4> *write_value_local;
  GLenum internalformat_local;
  BasicAllTargetsStore *this_local;
  
  os._368_8_ = write_value;
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  poVar1 = std::operator<<((ostream *)local_1a0,"#version 420 core\nlayout(");
  ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_
            (&local_1d0,(ShaderImageLoadStoreBase *)this,internalformat);
  poVar1 = std::operator<<(poVar1,(string *)&local_1d0);
  poVar1 = std::operator<<(poVar1,") writeonly uniform ");
  ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<float,4>>
            (&local_1f0,(ShaderImageLoadStoreBase *)this);
  poVar1 = std::operator<<(poVar1,(string *)&local_1f0);
  poVar1 = std::operator<<(poVar1,"image1D g_image_1d;\nlayout(");
  ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_
            (&local_210,(ShaderImageLoadStoreBase *)this,internalformat);
  poVar1 = std::operator<<(poVar1,(string *)&local_210);
  poVar1 = std::operator<<(poVar1,") writeonly uniform ");
  ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<float,4>>
            (&local_230,(ShaderImageLoadStoreBase *)this);
  poVar1 = std::operator<<(poVar1,(string *)&local_230);
  poVar1 = std::operator<<(poVar1,"image2D g_image_2d;\nlayout(");
  ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_
            (&local_250,(ShaderImageLoadStoreBase *)this,internalformat);
  poVar1 = std::operator<<(poVar1,(string *)&local_250);
  poVar1 = std::operator<<(poVar1,") writeonly uniform ");
  ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<float,4>>
            (&local_270,(ShaderImageLoadStoreBase *)this);
  poVar1 = std::operator<<(poVar1,(string *)&local_270);
  poVar1 = std::operator<<(poVar1,"image3D g_image_3d;\nlayout(");
  ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_
            (&local_290,(ShaderImageLoadStoreBase *)this,internalformat);
  poVar1 = std::operator<<(poVar1,(string *)&local_290);
  poVar1 = std::operator<<(poVar1,") writeonly uniform ");
  ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<float,4>>
            (&local_2b0,(ShaderImageLoadStoreBase *)this);
  poVar1 = std::operator<<(poVar1,(string *)&local_2b0);
  poVar1 = std::operator<<(poVar1,"image2DRect g_image_2drect;\nlayout(");
  ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_
            (&local_2d0,(ShaderImageLoadStoreBase *)this,internalformat);
  poVar1 = std::operator<<(poVar1,(string *)&local_2d0);
  poVar1 = std::operator<<(poVar1,") writeonly uniform ");
  ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<float,4>>
            (&local_2f0,(ShaderImageLoadStoreBase *)this);
  poVar1 = std::operator<<(poVar1,(string *)&local_2f0);
  poVar1 = std::operator<<(poVar1,"imageCube g_image_cube;\nlayout(");
  ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_
            (&local_310,(ShaderImageLoadStoreBase *)this,internalformat);
  poVar1 = std::operator<<(poVar1,(string *)&local_310);
  poVar1 = std::operator<<(poVar1,") writeonly uniform ");
  ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<float,4>>
            (&local_330,(ShaderImageLoadStoreBase *)this);
  poVar1 = std::operator<<(poVar1,(string *)&local_330);
  poVar1 = std::operator<<(poVar1,"imageBuffer g_image_buffer;\nlayout(");
  ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_
            (&local_350,(ShaderImageLoadStoreBase *)this,internalformat);
  poVar1 = std::operator<<(poVar1,(string *)&local_350);
  poVar1 = std::operator<<(poVar1,") writeonly uniform ");
  ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<float,4>>
            (&local_370,(ShaderImageLoadStoreBase *)this);
  poVar1 = std::operator<<(poVar1,(string *)&local_370);
  poVar1 = std::operator<<(poVar1,"image1DArray g_image_1darray;\nlayout(");
  ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_
            (&local_390,(ShaderImageLoadStoreBase *)this,internalformat);
  poVar1 = std::operator<<(poVar1,(string *)&local_390);
  poVar1 = std::operator<<(poVar1,") writeonly uniform ");
  ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<float,4>>
            (&local_3b0,(ShaderImageLoadStoreBase *)this);
  poVar1 = std::operator<<(poVar1,(string *)&local_3b0);
  poVar1 = std::operator<<(poVar1,
                           "image2DArray g_image_2darray;\nvoid main() {\n  ivec2 coord = ivec2(gl_FragCoord.xy);\n  imageStore(g_image_1d, coord.x, "
                          );
  ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<float,4>>
            (&local_3d0,(ShaderImageLoadStoreBase *)this);
  poVar1 = std::operator<<(poVar1,(string *)&local_3d0);
  poVar1 = std::operator<<(poVar1,"vec4");
  poVar1 = tcu::operator<<(poVar1,(Vector<float,_4> *)os._368_8_);
  poVar1 = std::operator<<(poVar1,");\n  imageStore(g_image_2d, coord, ");
  ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<float,4>>
            (&local_3f0,(ShaderImageLoadStoreBase *)this);
  poVar1 = std::operator<<(poVar1,(string *)&local_3f0);
  poVar1 = std::operator<<(poVar1,"vec4");
  poVar1 = tcu::operator<<(poVar1,(Vector<float,_4> *)os._368_8_);
  poVar1 = std::operator<<(poVar1,");\n  imageStore(g_image_3d, ivec3(coord.xy, 0), ");
  ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<float,4>>
            (&local_410,(ShaderImageLoadStoreBase *)this);
  poVar1 = std::operator<<(poVar1,(string *)&local_410);
  poVar1 = std::operator<<(poVar1,"vec4");
  poVar1 = tcu::operator<<(poVar1,(Vector<float,_4> *)os._368_8_);
  poVar1 = std::operator<<(poVar1,");\n  imageStore(g_image_3d, ivec3(coord.xy, 1), ");
  ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<float,4>>
            (&local_430,(ShaderImageLoadStoreBase *)this);
  poVar1 = std::operator<<(poVar1,(string *)&local_430);
  poVar1 = std::operator<<(poVar1,"vec4");
  poVar1 = tcu::operator<<(poVar1,(Vector<float,_4> *)os._368_8_);
  poVar1 = std::operator<<(poVar1,");\n  imageStore(g_image_2drect, coord, ");
  ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<float,4>>
            (&local_450,(ShaderImageLoadStoreBase *)this);
  poVar1 = std::operator<<(poVar1,(string *)&local_450);
  poVar1 = std::operator<<(poVar1,"vec4");
  poVar1 = tcu::operator<<(poVar1,(Vector<float,_4> *)os._368_8_);
  poVar1 = std::operator<<(poVar1,");\n  imageStore(g_image_cube, ivec3(coord, 0), ");
  ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<float,4>>
            (&local_470,(ShaderImageLoadStoreBase *)this);
  poVar1 = std::operator<<(poVar1,(string *)&local_470);
  poVar1 = std::operator<<(poVar1,"vec4");
  poVar1 = tcu::operator<<(poVar1,(Vector<float,_4> *)os._368_8_);
  poVar1 = std::operator<<(poVar1,");\n  imageStore(g_image_cube, ivec3(coord, 1), ");
  ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<float,4>>
            (&local_490,(ShaderImageLoadStoreBase *)this);
  poVar1 = std::operator<<(poVar1,(string *)&local_490);
  poVar1 = std::operator<<(poVar1,"vec4");
  poVar1 = tcu::operator<<(poVar1,(Vector<float,_4> *)os._368_8_);
  poVar1 = std::operator<<(poVar1,");\n  imageStore(g_image_cube, ivec3(coord, 2), ");
  ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<float,4>>
            (&local_4b0,(ShaderImageLoadStoreBase *)this);
  poVar1 = std::operator<<(poVar1,(string *)&local_4b0);
  poVar1 = std::operator<<(poVar1,"vec4");
  poVar1 = tcu::operator<<(poVar1,(Vector<float,_4> *)os._368_8_);
  poVar1 = std::operator<<(poVar1,");\n  imageStore(g_image_cube, ivec3(coord, 3), ");
  ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<float,4>>
            (&local_4d0,(ShaderImageLoadStoreBase *)this);
  poVar1 = std::operator<<(poVar1,(string *)&local_4d0);
  poVar1 = std::operator<<(poVar1,"vec4");
  poVar1 = tcu::operator<<(poVar1,(Vector<float,_4> *)os._368_8_);
  poVar1 = std::operator<<(poVar1,");\n  imageStore(g_image_cube, ivec3(coord, 4), ");
  ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<float,4>>
            (&local_4f0,(ShaderImageLoadStoreBase *)this);
  poVar1 = std::operator<<(poVar1,(string *)&local_4f0);
  poVar1 = std::operator<<(poVar1,"vec4");
  poVar1 = tcu::operator<<(poVar1,(Vector<float,_4> *)os._368_8_);
  poVar1 = std::operator<<(poVar1,");\n  imageStore(g_image_cube, ivec3(coord, 5), ");
  ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<float,4>>
            (&local_510,(ShaderImageLoadStoreBase *)this);
  poVar1 = std::operator<<(poVar1,(string *)&local_510);
  poVar1 = std::operator<<(poVar1,"vec4");
  poVar1 = tcu::operator<<(poVar1,(Vector<float,_4> *)os._368_8_);
  poVar1 = std::operator<<(poVar1,");\n  imageStore(g_image_buffer, coord.x, ");
  ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<float,4>>
            (&local_530,(ShaderImageLoadStoreBase *)this);
  poVar1 = std::operator<<(poVar1,(string *)&local_530);
  poVar1 = std::operator<<(poVar1,"vec4");
  poVar1 = tcu::operator<<(poVar1,(Vector<float,_4> *)os._368_8_);
  poVar1 = std::operator<<(poVar1,");\n  imageStore(g_image_1darray, ivec2(coord.x, 0), ");
  ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<float,4>>
            (&local_550,(ShaderImageLoadStoreBase *)this);
  poVar1 = std::operator<<(poVar1,(string *)&local_550);
  poVar1 = std::operator<<(poVar1,"vec4");
  poVar1 = tcu::operator<<(poVar1,(Vector<float,_4> *)os._368_8_);
  poVar1 = std::operator<<(poVar1,");\n  imageStore(g_image_1darray, ivec2(coord.x, 1), ");
  ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<float,4>>
            (&local_570,(ShaderImageLoadStoreBase *)this);
  poVar1 = std::operator<<(poVar1,(string *)&local_570);
  poVar1 = std::operator<<(poVar1,"vec4");
  poVar1 = tcu::operator<<(poVar1,(Vector<float,_4> *)os._368_8_);
  poVar1 = std::operator<<(poVar1,");\n  imageStore(g_image_2darray, ivec3(coord, 0), ");
  ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<float,4>>
            (&local_590,(ShaderImageLoadStoreBase *)this);
  poVar1 = std::operator<<(poVar1,(string *)&local_590);
  poVar1 = std::operator<<(poVar1,"vec4");
  poVar1 = tcu::operator<<(poVar1,(Vector<float,_4> *)os._368_8_);
  poVar1 = std::operator<<(poVar1,");\n  imageStore(g_image_2darray, ivec3(coord, 1), ");
  ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<float,4>>
            (&local_5b0,(ShaderImageLoadStoreBase *)this);
  poVar1 = std::operator<<(poVar1,(string *)&local_5b0);
  poVar1 = std::operator<<(poVar1,"vec4");
  poVar1 = tcu::operator<<(poVar1,(Vector<float,_4> *)os._368_8_);
  std::operator<<(poVar1,");\n  discard;\n}");
  std::__cxx11::string::~string((string *)&local_5b0);
  std::__cxx11::string::~string((string *)&local_590);
  std::__cxx11::string::~string((string *)&local_570);
  std::__cxx11::string::~string((string *)&local_550);
  std::__cxx11::string::~string((string *)&local_530);
  std::__cxx11::string::~string((string *)&local_510);
  std::__cxx11::string::~string((string *)&local_4f0);
  std::__cxx11::string::~string((string *)&local_4d0);
  std::__cxx11::string::~string((string *)&local_4b0);
  std::__cxx11::string::~string((string *)&local_490);
  std::__cxx11::string::~string((string *)&local_470);
  std::__cxx11::string::~string((string *)&local_450);
  std::__cxx11::string::~string((string *)&local_430);
  std::__cxx11::string::~string((string *)&local_410);
  std::__cxx11::string::~string((string *)&local_3f0);
  std::__cxx11::string::~string((string *)&local_3d0);
  std::__cxx11::string::~string((string *)&local_3b0);
  std::__cxx11::string::~string((string *)&local_390);
  std::__cxx11::string::~string((string *)&local_370);
  std::__cxx11::string::~string((string *)&local_350);
  std::__cxx11::string::~string((string *)&local_330);
  std::__cxx11::string::~string((string *)&local_310);
  std::__cxx11::string::~string((string *)&local_2f0);
  std::__cxx11::string::~string((string *)&local_2d0);
  std::__cxx11::string::~string((string *)&local_2b0);
  std::__cxx11::string::~string((string *)&local_290);
  std::__cxx11::string::~string((string *)&local_270);
  std::__cxx11::string::~string((string *)&local_250);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string GenFS(GLenum internalformat, const T& write_value)
	{
		std::ostringstream os;
		os << "#version 420 core" NL "layout(" << FormatEnumToString(internalformat) << ") writeonly uniform "
		   << TypePrefix<T>() << "image1D g_image_1d;" NL "layout(" << FormatEnumToString(internalformat)
		   << ") writeonly uniform " << TypePrefix<T>() << "image2D g_image_2d;" NL "layout("
		   << FormatEnumToString(internalformat) << ") writeonly uniform " << TypePrefix<T>()
		   << "image3D g_image_3d;" NL "layout(" << FormatEnumToString(internalformat) << ") writeonly uniform "
		   << TypePrefix<T>() << "image2DRect g_image_2drect;" NL "layout(" << FormatEnumToString(internalformat)
		   << ") writeonly uniform " << TypePrefix<T>() << "imageCube g_image_cube;" NL "layout("
		   << FormatEnumToString(internalformat) << ") writeonly uniform " << TypePrefix<T>()
		   << "imageBuffer g_image_buffer;" NL "layout(" << FormatEnumToString(internalformat) << ") writeonly uniform "
		   << TypePrefix<T>() << "image1DArray g_image_1darray;" NL "layout(" << FormatEnumToString(internalformat)
		   << ") writeonly uniform " << TypePrefix<T>()
		   << "image2DArray g_image_2darray;" NL "void main() {" NL "  ivec2 coord = ivec2(gl_FragCoord.xy);" NL
			  "  imageStore(g_image_1d, coord.x, "
		   << TypePrefix<T>() << "vec4" << write_value << ");" NL "  imageStore(g_image_2d, coord, " << TypePrefix<T>()
		   << "vec4" << write_value << ");" NL "  imageStore(g_image_3d, ivec3(coord.xy, 0), " << TypePrefix<T>()
		   << "vec4" << write_value << ");" NL "  imageStore(g_image_3d, ivec3(coord.xy, 1), " << TypePrefix<T>()
		   << "vec4" << write_value << ");" NL "  imageStore(g_image_2drect, coord, " << TypePrefix<T>() << "vec4"
		   << write_value << ");" NL "  imageStore(g_image_cube, ivec3(coord, 0), " << TypePrefix<T>() << "vec4"
		   << write_value << ");" NL "  imageStore(g_image_cube, ivec3(coord, 1), " << TypePrefix<T>() << "vec4"
		   << write_value << ");" NL "  imageStore(g_image_cube, ivec3(coord, 2), " << TypePrefix<T>() << "vec4"
		   << write_value << ");" NL "  imageStore(g_image_cube, ivec3(coord, 3), " << TypePrefix<T>() << "vec4"
		   << write_value << ");" NL "  imageStore(g_image_cube, ivec3(coord, 4), " << TypePrefix<T>() << "vec4"
		   << write_value << ");" NL "  imageStore(g_image_cube, ivec3(coord, 5), " << TypePrefix<T>() << "vec4"
		   << write_value << ");" NL "  imageStore(g_image_buffer, coord.x, " << TypePrefix<T>() << "vec4"
		   << write_value << ");" NL "  imageStore(g_image_1darray, ivec2(coord.x, 0), " << TypePrefix<T>() << "vec4"
		   << write_value << ");" NL "  imageStore(g_image_1darray, ivec2(coord.x, 1), " << TypePrefix<T>() << "vec4"
		   << write_value << ");" NL "  imageStore(g_image_2darray, ivec3(coord, 0), " << TypePrefix<T>() << "vec4"
		   << write_value << ");" NL "  imageStore(g_image_2darray, ivec3(coord, 1), " << TypePrefix<T>() << "vec4"
		   << write_value << ");" NL "  discard;" NL "}";
		return os.str();
	}